

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Am_Web_Data::Clear_Invalid(Am_Web_Data *this)

{
  Input_Port *pIVar1;
  Input_Port *this_00;
  
  pIVar1 = this->invalid_list;
  while (this_00 = pIVar1, this_00 != (Input_Port *)0x0) {
    this_00->invalid = false;
    pIVar1 = this_00->next_invalid;
    this_00->next_invalid = (Input_Port *)0x0;
    if (this_00->changed == false) {
      Am_Slot::Validate(&this_00->context);
    }
  }
  this->invalid_list = (Input_Port *)0x0;
  return;
}

Assistant:

void
Am_Web_Data::Clear_Invalid()
{
  Input_Port *curr = invalid_list;
  Input_Port *next;
  while (curr) {
    curr->invalid = false;
    next = curr->next_invalid;
    curr->next_invalid = nullptr;
    if (!curr->changed)
      curr->context.Validate();
    curr = next;
  }
  invalid_list = nullptr;
}